

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::LRN_x86_fma::forward_inplace(LRN_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int *piVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  Mat *pMVar12;
  pointer piVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  _func_int ***ppp_Var20;
  ulong uVar21;
  int iVar22;
  float *pfVar23;
  undefined1 (*pauVar24) [32];
  uint uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  void *pvVar32;
  undefined1 (*pauVar33) [32];
  float fVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  allocator_type local_1d9;
  undefined1 local_1d8 [12];
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  int iStack_1c4;
  int local_1c0;
  Allocator *local_1b8;
  int iStack_1b0;
  float fStack_1ac;
  int iStack_1a8;
  int iStack_1a4;
  int iStack_1a0;
  size_t local_198;
  undefined8 local_190;
  Mat *local_188;
  ulong local_180;
  ulong local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined4 local_158;
  int iStack_154;
  int local_150;
  Allocator *local_148;
  int iStack_140;
  float fStack_13c;
  undefined8 uStack_138;
  int local_130;
  size_t local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  long local_e0;
  Allocator *local_d8;
  long local_d0;
  void *local_c8;
  long local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  vector<int,_std::allocator<int>_> _space_ofs;
  
  local_118 = (float)bottom_top_blob->w;
  local_190 = (ulong)(uint)bottom_top_blob->h;
  uVar26 = bottom_top_blob->c;
  uVar21 = (ulong)uVar26;
  _elemsize = bottom_top_blob->elemsize;
  local_128 = 0;
  local_168._0_8_ = (Allocator *)0x0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0.0;
  local_158 = 0;
  local_150 = 0;
  uStack_138 = SUB168(ZEXT816(0) << 0x40,4);
  fStack_114 = 0.0;
  iStack_154 = local_168._8_4_;
  local_148 = (Allocator *)local_168._0_8_;
  iStack_140 = local_168._8_4_;
  fStack_13c = (float)local_168._12_4_;
  local_130 = local_150;
  Mat::create((Mat *)local_168,(int)local_118,bottom_top_blob->h,uVar26,_elemsize,
              opt->workspace_allocator);
  iVar17 = -100;
  if (((Allocator *)local_168._0_8_ == (Allocator *)0x0) || ((long)local_130 * local_128 == 0))
  goto LAB_0032fe0f;
  uVar25 = (int)local_190 * (int)local_118;
  if (0 < (int)uVar26) {
    uVar19 = 0;
    do {
      pfVar23 = (float *)(bottom_top_blob->cstep * uVar19 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var20 = (_func_int ***)
                  ((long)(_func_int ***)local_168._0_8_ +
                  local_128 * uVar19 * CONCAT44(iStack_154,local_158));
      if ((int)uVar25 < 8) {
        uVar15 = 0;
      }
      else {
        iVar28 = 7;
        do {
          auVar1._4_4_ = pfVar23[1] * pfVar23[1];
          auVar1._0_4_ = *pfVar23 * *pfVar23;
          auVar1._8_4_ = pfVar23[2] * pfVar23[2];
          auVar1._12_4_ = pfVar23[3] * pfVar23[3];
          auVar1._16_4_ = pfVar23[4] * pfVar23[4];
          auVar1._20_4_ = pfVar23[5] * pfVar23[5];
          auVar1._24_4_ = pfVar23[6] * pfVar23[6];
          auVar1._28_4_ = pfVar23[7];
          *(undefined1 (*) [32])ppp_Var20 = auVar1;
          pfVar23 = pfVar23 + 8;
          ppp_Var20 = ppp_Var20 + 4;
          iVar28 = iVar28 + 8;
          uVar15 = uVar25 & 0xfffffff8;
        } while (iVar28 < (int)uVar25);
      }
      if (uVar25 - uVar15 != 0 && (int)uVar15 <= (int)uVar25) {
        lVar30 = 0;
        do {
          *(float *)((long)ppp_Var20 + lVar30 * 4) = pfVar23[lVar30] * pfVar23[lVar30];
          lVar30 = lVar30 + 1;
        } while (uVar25 - uVar15 != (int)lVar30);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar21);
  }
  iVar28 = (this->super_LRN).region_type;
  local_188 = bottom_top_blob;
  local_180 = uVar21;
  if (iVar28 == 0) {
    local_198 = 0;
    local_1d8._0_8_ = (void *)0x0;
    local_1d8._8_4_ = 0;
    uStack_1cc = 0.0;
    local_1c8 = 0;
    iStack_1c4 = 0;
    local_1c0 = 0;
    local_1b8 = (Allocator *)0x0;
    iStack_1b0 = 0;
    fStack_1ac = 0.0;
    iStack_1a8 = 0;
    iStack_1a4 = 0;
    iStack_1a0 = 0;
    Mat::create((Mat *)local_1d8,(int)local_118,(int)local_190,uVar26,_elemsize,
                opt->workspace_allocator);
    bVar14 = (void *)local_1d8._0_8_ == (void *)0x0 || (long)iStack_1a0 * local_198 == 0;
    if (bVar14) {
      piVar9 = (int *)CONCAT44(uStack_1cc,local_1d8._8_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_1b8 == (Allocator *)0x0) {
            if ((void *)local_1d8._0_8_ != (void *)0x0) {
              free((void *)local_1d8._0_8_);
            }
          }
          else {
            (*local_1b8->_vptr_Allocator[3])();
          }
        }
      }
      local_198 = 0;
      local_1d8._0_8_ = (void *)0x0;
      local_1d8._8_4_ = 0;
      uStack_1cc = 0.0;
      local_1c8 = 0;
      iStack_1c4 = 0;
      local_1c0 = 0;
      iStack_1b0 = 0;
      fStack_1ac = 0.0;
      iStack_1a8 = 0;
      iStack_1a4 = 0;
      iStack_1a0 = 0;
      goto LAB_0032fe0f;
    }
    local_170 = CONCAT71(local_170._1_7_,bVar14);
    if (0 < iStack_1a0 * (int)local_198) {
      memset((void *)local_1d8._0_8_,0,(ulong)(uint)(iStack_1a0 * (int)local_198) << 2);
    }
    if (0 < (int)uVar26) {
      local_f8 = ZEXT416((uint)((this->super_LRN).alpha / (float)(this->super_LRN).local_size));
      auVar65 = ZEXT1664(local_f8);
      auVar38 = vshufps_avx(local_f8,local_f8,0);
      local_b8._16_16_ = auVar38;
      local_b8._0_16_ = auVar38;
      uVar19 = 0;
      local_190 = CONCAT44(local_190._4_4_,uVar25) & 0xfffffffffffffff8;
      uVar26 = uVar25 & 0xfffffff8;
      do {
        auVar69._8_4_ = 0x3f000000;
        auVar69._0_8_ = 0x3f0000003f000000;
        auVar68._8_4_ = 0x3d9021bb;
        auVar68._0_8_ = 0x3d9021bb3d9021bb;
        auVar47._8_4_ = 0xbdebd1b8;
        auVar47._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar69._12_4_ = 0x3f000000;
        auVar68._12_4_ = 0x3d9021bb;
        auVar47._12_4_ = 0xbdebd1b8;
        auVar69._16_4_ = 0x3f000000;
        auVar68._16_4_ = 0x3d9021bb;
        auVar47._16_4_ = 0xbdebd1b8;
        auVar69._20_4_ = 0x3f000000;
        auVar68._20_4_ = 0x3d9021bb;
        auVar47._20_4_ = 0xbdebd1b8;
        auVar69._24_4_ = 0x3f000000;
        auVar68._24_4_ = 0x3d9021bb;
        auVar47._24_4_ = 0xbdebd1b8;
        auVar69._28_4_ = 0x3f000000;
        auVar68._28_4_ = 0x3d9021bb;
        auVar47._28_4_ = 0xbdebd1b8;
        iVar17 = (this->super_LRN).local_size / 2;
        iVar28 = (int)uVar19;
        uVar15 = iVar28 - iVar17;
        if ((int)uVar15 <= iVar17 + iVar28) {
          do {
            if (uVar15 < (uint)uVar21) {
              ppp_Var20 = (_func_int ***)
                          ((long)(_func_int ***)local_168._0_8_ +
                          uVar15 * local_128 * CONCAT44(iStack_154,local_158));
              pauVar24 = (undefined1 (*) [32])
                         (local_198 * uVar19 * CONCAT44(iStack_1c4,local_1c8) + local_1d8._0_8_);
              uVar29 = 0;
              if (7 < (int)uVar25) {
                iVar17 = 7;
                do {
                  auVar35._0_4_ = *(float *)*pauVar24 + *(float *)ppp_Var20;
                  auVar35._4_4_ = *(float *)(*pauVar24 + 4) + *(float *)((long)ppp_Var20 + 4);
                  auVar35._8_4_ = *(float *)(*pauVar24 + 8) + *(float *)(ppp_Var20 + 1);
                  auVar35._12_4_ =
                       *(float *)(*pauVar24 + 0xc) + *(float *)((long)(ppp_Var20 + 1) + 4);
                  auVar35._16_4_ = *(float *)(*pauVar24 + 0x10) + *(float *)(ppp_Var20 + 2);
                  auVar35._20_4_ =
                       *(float *)(*pauVar24 + 0x14) + *(float *)((long)(ppp_Var20 + 2) + 4);
                  auVar35._24_4_ = *(float *)(*pauVar24 + 0x18) + *(float *)(ppp_Var20 + 3);
                  auVar35._28_4_ =
                       *(float *)(*pauVar24 + 0x1c) + *(float *)((long)(ppp_Var20 + 3) + 4);
                  *pauVar24 = auVar35;
                  ppp_Var20 = ppp_Var20 + 4;
                  pauVar24 = pauVar24 + 1;
                  iVar17 = iVar17 + 8;
                  uVar29 = uVar26;
                } while (iVar17 < (int)uVar25);
              }
              if (uVar25 - uVar29 != 0 && (int)uVar29 <= (int)uVar25) {
                lVar30 = 0;
                do {
                  *(float *)(*pauVar24 + lVar30 * 4) =
                       *(float *)(*pauVar24 + lVar30 * 4) + *(float *)((long)ppp_Var20 + lVar30 * 4)
                  ;
                  lVar30 = lVar30 + 1;
                } while (uVar25 - uVar29 != (int)lVar30);
              }
            }
            bVar14 = (int)uVar15 < (this->super_LRN).local_size / 2 + iVar28;
            uVar15 = uVar15 + 1;
          } while (bVar14);
        }
        pauVar24 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar19 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        pauVar33 = (undefined1 (*) [32])
                   (local_198 * uVar19 * CONCAT44(iStack_1c4,local_1c8) + local_1d8._0_8_);
        uVar15 = 0;
        if (7 < (int)uVar25) {
          local_118 = (this->super_LRN).bias;
          fVar34 = (this->super_LRN).beta;
          auVar38._0_8_ = CONCAT44(fVar34,fVar34) ^ 0x8000000080000000;
          auVar38._8_4_ = -fVar34;
          auVar38._12_4_ = -fVar34;
          auVar36._16_16_ = auVar38;
          auVar36._0_16_ = auVar38;
          iVar17 = 7;
          auVar37._8_4_ = 0xb95e8083;
          auVar37._0_8_ = 0xb95e8083b95e8083;
          auVar37._12_4_ = 0xb95e8083;
          auVar37._16_4_ = 0xb95e8083;
          auVar37._20_4_ = 0xb95e8083;
          auVar37._24_4_ = 0xb95e8083;
          auVar37._28_4_ = 0xb95e8083;
          auVar66._8_4_ = 0x3f318000;
          auVar66._0_8_ = 0x3f3180003f318000;
          auVar66._12_4_ = 0x3f318000;
          auVar66._16_4_ = 0x3f318000;
          auVar66._20_4_ = 0x3f318000;
          auVar66._24_4_ = 0x3f318000;
          auVar66._28_4_ = 0x3f318000;
          auVar39._8_4_ = 0xffffff81;
          auVar39._0_8_ = 0xffffff81ffffff81;
          auVar39._12_4_ = 0xffffff81;
          auVar67._8_4_ = 0x3f800000;
          auVar67._0_8_ = 0x3f8000003f800000;
          auVar67._12_4_ = 0x3f800000;
          do {
            auVar10._4_4_ = local_118;
            auVar10._0_4_ = local_118;
            auVar10._8_4_ = local_118;
            auVar10._12_4_ = local_118;
            auVar10._16_4_ = local_118;
            auVar10._20_4_ = local_118;
            auVar10._24_4_ = local_118;
            auVar10._28_4_ = local_118;
            auVar4 = vfmadd132ps_fma(*pauVar33,auVar10,local_b8);
            auVar41._8_4_ = 0x800000;
            auVar41._0_8_ = 0x80000000800000;
            auVar41._12_4_ = 0x800000;
            auVar41._16_4_ = 0x800000;
            auVar41._20_4_ = 0x800000;
            auVar41._24_4_ = 0x800000;
            auVar41._28_4_ = 0x800000;
            auVar2 = vmaxps_avx(ZEXT1632(auVar4),auVar41);
            auVar46 = vpsrld_avx(auVar2._0_16_,0x17);
            auVar50._8_4_ = 0x807fffff;
            auVar50._0_8_ = 0x807fffff807fffff;
            auVar50._12_4_ = 0x807fffff;
            auVar50._16_4_ = 0x807fffff;
            auVar50._20_4_ = 0x807fffff;
            auVar50._24_4_ = 0x807fffff;
            auVar50._28_4_ = 0x807fffff;
            auVar1 = vandps_avx(auVar2,auVar50);
            auVar3 = vorps_avx(auVar69,auVar1);
            auVar54._8_4_ = 0x3f3504f3;
            auVar54._0_8_ = 0x3f3504f33f3504f3;
            auVar54._12_4_ = 0x3f3504f3;
            auVar54._16_4_ = 0x3f3504f3;
            auVar54._20_4_ = 0x3f3504f3;
            auVar54._24_4_ = 0x3f3504f3;
            auVar54._28_4_ = 0x3f3504f3;
            auVar35 = vcmpps_avx(auVar54,auVar3,2);
            auVar1 = vandnps_avx(auVar35,auVar3);
            auVar61 = vpsrld_avx(auVar2._16_16_,0x17);
            auVar42._0_4_ = auVar3._0_4_ + -1.0 + auVar1._0_4_;
            auVar42._4_4_ = auVar3._4_4_ + -1.0 + auVar1._4_4_;
            auVar42._8_4_ = auVar3._8_4_ + -1.0 + auVar1._8_4_;
            auVar42._12_4_ = auVar3._12_4_ + -1.0 + auVar1._12_4_;
            auVar42._16_4_ = auVar3._16_4_ + -1.0 + auVar1._16_4_;
            auVar42._20_4_ = auVar3._20_4_ + -1.0 + auVar1._20_4_;
            auVar42._24_4_ = auVar3._24_4_ + -1.0 + auVar1._24_4_;
            auVar42._28_4_ = auVar3._28_4_ + -1.0 + auVar1._28_4_;
            auVar46 = vpsubd_avx(auVar46,auVar35._0_16_);
            auVar61 = vpsubd_avx(auVar61,auVar35._16_16_);
            auVar46 = vpaddd_avx(auVar46,auVar39);
            auVar5 = vfmadd213ps_fma(auVar68,auVar42,auVar47);
            auVar61 = vpaddd_avx(auVar61,auVar39);
            auVar58._8_4_ = 0x3def251a;
            auVar58._0_8_ = 0x3def251a3def251a;
            auVar58._12_4_ = 0x3def251a;
            auVar58._16_4_ = 0x3def251a;
            auVar58._20_4_ = 0x3def251a;
            auVar58._24_4_ = 0x3def251a;
            auVar58._28_4_ = 0x3def251a;
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar42,auVar58);
            auVar59._8_4_ = 0xbdfe5d4f;
            auVar59._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar59._12_4_ = 0xbdfe5d4f;
            auVar59._16_4_ = 0xbdfe5d4f;
            auVar59._20_4_ = 0xbdfe5d4f;
            auVar59._24_4_ = 0xbdfe5d4f;
            auVar59._28_4_ = 0xbdfe5d4f;
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar42,auVar59);
            auVar60._8_4_ = 0x3e11e9bf;
            auVar60._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar60._12_4_ = 0x3e11e9bf;
            auVar60._16_4_ = 0x3e11e9bf;
            auVar60._20_4_ = 0x3e11e9bf;
            auVar60._24_4_ = 0x3e11e9bf;
            auVar60._28_4_ = 0x3e11e9bf;
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar42,auVar60);
            auVar2._4_4_ = auVar42._4_4_ * auVar42._4_4_;
            auVar2._0_4_ = auVar42._0_4_ * auVar42._0_4_;
            auVar2._8_4_ = auVar42._8_4_ * auVar42._8_4_;
            auVar2._12_4_ = auVar42._12_4_ * auVar42._12_4_;
            auVar2._16_4_ = auVar42._16_4_ * auVar42._16_4_;
            auVar2._20_4_ = auVar42._20_4_ * auVar42._20_4_;
            auVar2._24_4_ = auVar42._24_4_ * auVar42._24_4_;
            auVar2._28_4_ = 0x3e11e9bf;
            auVar62._8_4_ = 0xbe2aae50;
            auVar62._0_8_ = 0xbe2aae50be2aae50;
            auVar62._12_4_ = 0xbe2aae50;
            auVar62._16_4_ = 0xbe2aae50;
            auVar62._20_4_ = 0xbe2aae50;
            auVar62._24_4_ = 0xbe2aae50;
            auVar62._28_4_ = 0xbe2aae50;
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar42,auVar62);
            auVar63._8_4_ = 0x3e4cceac;
            auVar63._0_8_ = 0x3e4cceac3e4cceac;
            auVar63._12_4_ = 0x3e4cceac;
            auVar63._16_4_ = 0x3e4cceac;
            auVar63._20_4_ = 0x3e4cceac;
            auVar63._24_4_ = 0x3e4cceac;
            auVar63._28_4_ = 0x3e4cceac;
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar42,auVar63);
            auVar64._8_4_ = 0xbe7ffffc;
            auVar64._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar64._12_4_ = 0xbe7ffffc;
            auVar64._16_4_ = 0xbe7ffffc;
            auVar64._20_4_ = 0xbe7ffffc;
            auVar64._24_4_ = 0xbe7ffffc;
            auVar64._28_4_ = 0xbe7ffffc;
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar42,auVar64);
            auVar48._16_16_ = auVar61;
            auVar48._0_16_ = auVar46;
            auVar51._8_4_ = 0x3eaaaaaa;
            auVar51._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar51._12_4_ = 0x3eaaaaaa;
            auVar51._16_4_ = 0x3eaaaaaa;
            auVar51._20_4_ = 0x3eaaaaaa;
            auVar51._24_4_ = 0x3eaaaaaa;
            auVar51._28_4_ = 0x3eaaaaaa;
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar42,auVar51);
            auVar3._4_4_ = auVar42._4_4_ * auVar42._4_4_ * auVar42._4_4_ * auVar46._4_4_;
            auVar3._0_4_ = auVar42._0_4_ * auVar42._0_4_ * auVar42._0_4_ * auVar46._0_4_;
            auVar3._8_4_ = auVar42._8_4_ * auVar42._8_4_ * auVar42._8_4_ * auVar46._8_4_;
            auVar3._12_4_ = auVar42._12_4_ * auVar42._12_4_ * auVar42._12_4_ * auVar46._12_4_;
            auVar3._16_4_ = auVar42._16_4_ * auVar42._16_4_ * auVar42._16_4_ * 0.0;
            auVar3._20_4_ = auVar42._20_4_ * auVar42._20_4_ * auVar42._20_4_ * 0.0;
            auVar3._24_4_ = auVar42._24_4_ * auVar42._24_4_ * auVar42._24_4_ * 0.0;
            auVar3._28_4_ = 0x3eaaaaaa;
            auVar35 = vcvtdq2ps_avx(auVar48);
            auVar46 = vfmadd231ps_fma(auVar3,auVar35,auVar37);
            auVar46 = vfmsub231ps_fma(ZEXT1632(auVar46),auVar69,auVar2);
            auVar2 = vsubps_avx(ZEXT1632(auVar46),auVar42);
            auVar1 = vcmpps_avx(ZEXT1632(auVar4),_DAT_005f41e0,2);
            auVar46 = vfmsub231ps_fma(auVar2,auVar66,auVar35);
            auVar1 = vorps_avx(auVar1,ZEXT1632(auVar46));
            local_98._0_4_ = (undefined4)auVar38._0_8_;
            local_98._4_4_ = (undefined4)(auVar38._0_8_ >> 0x20);
            auVar6._4_4_ = auVar1._4_4_ * (float)local_98._4_4_;
            auVar6._0_4_ = auVar1._0_4_ * (float)local_98._0_4_;
            auVar6._8_4_ = auVar1._8_4_ * auVar38._8_4_;
            auVar6._12_4_ = auVar1._12_4_ * auVar38._12_4_;
            auVar6._16_4_ = auVar1._16_4_ * (float)local_98._0_4_;
            auVar6._20_4_ = auVar1._20_4_ * (float)local_98._4_4_;
            auVar6._24_4_ = auVar1._24_4_ * auVar38._8_4_;
            auVar6._28_4_ = auVar1._28_4_;
            auVar43._8_4_ = 0x42b0c0a5;
            auVar43._0_8_ = 0x42b0c0a542b0c0a5;
            auVar43._12_4_ = 0x42b0c0a5;
            auVar43._16_4_ = 0x42b0c0a5;
            auVar43._20_4_ = 0x42b0c0a5;
            auVar43._24_4_ = 0x42b0c0a5;
            auVar43._28_4_ = 0x42b0c0a5;
            auVar1 = vminps_avx(auVar6,auVar43);
            auVar44._8_4_ = 0xc2b0c0a5;
            auVar44._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar44._12_4_ = 0xc2b0c0a5;
            auVar44._16_4_ = 0xc2b0c0a5;
            auVar44._20_4_ = 0xc2b0c0a5;
            auVar44._24_4_ = 0xc2b0c0a5;
            auVar44._28_4_ = 0xc2b0c0a5;
            auVar35 = vmaxps_avx(auVar1,auVar44);
            auVar45._8_4_ = 0x3fb8aa3b;
            auVar45._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar45._12_4_ = 0x3fb8aa3b;
            auVar45._16_4_ = 0x3fb8aa3b;
            auVar45._20_4_ = 0x3fb8aa3b;
            auVar45._24_4_ = 0x3fb8aa3b;
            auVar45._28_4_ = 0x3fb8aa3b;
            auVar46 = vfmadd213ps_fma(auVar45,auVar35,auVar69);
            auVar2 = vroundps_avx(ZEXT1632(auVar46),1);
            auVar1 = vcmpps_avx(ZEXT1632(auVar46),auVar2,1);
            auVar52._8_4_ = 0x3f800000;
            auVar52._0_8_ = 0x3f8000003f800000;
            auVar52._12_4_ = 0x3f800000;
            auVar52._16_4_ = 0x3f800000;
            auVar52._20_4_ = 0x3f800000;
            auVar52._24_4_ = 0x3f800000;
            auVar52._28_4_ = 0x3f800000;
            auVar1 = vandps_avx(auVar1,auVar52);
            auVar1 = vsubps_avx(auVar2,auVar1);
            auVar46 = vfmsub231ps_fma(auVar35,auVar1,auVar66);
            auVar61 = vfnmsub231ps_fma(ZEXT1632(auVar46),auVar1,auVar37);
            auVar49._8_4_ = 0x39506967;
            auVar49._0_8_ = 0x3950696739506967;
            auVar49._12_4_ = 0x39506967;
            auVar49._16_4_ = 0x39506967;
            auVar49._20_4_ = 0x39506967;
            auVar49._24_4_ = 0x39506967;
            auVar49._28_4_ = 0x39506967;
            auVar53._8_4_ = 0x3ab743ce;
            auVar53._0_8_ = 0x3ab743ce3ab743ce;
            auVar53._12_4_ = 0x3ab743ce;
            auVar53._16_4_ = 0x3ab743ce;
            auVar53._20_4_ = 0x3ab743ce;
            auVar53._24_4_ = 0x3ab743ce;
            auVar53._28_4_ = 0x3ab743ce;
            auVar46 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar61),auVar53);
            auVar7._28_4_ = 0x3ab743ce;
            auVar7._0_28_ =
                 ZEXT1628(CONCAT412(auVar61._12_4_ * auVar61._12_4_,
                                    CONCAT48(auVar61._8_4_ * auVar61._8_4_,
                                             CONCAT44(auVar61._4_4_ * auVar61._4_4_,
                                                      auVar61._0_4_ * auVar61._0_4_))));
            auVar55._8_4_ = 0x3c088908;
            auVar55._0_8_ = 0x3c0889083c088908;
            auVar55._12_4_ = 0x3c088908;
            auVar55._16_4_ = 0x3c088908;
            auVar55._20_4_ = 0x3c088908;
            auVar55._24_4_ = 0x3c088908;
            auVar55._28_4_ = 0x3c088908;
            auVar35 = ZEXT1632(auVar61);
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar35,auVar55);
            auVar56._8_4_ = 0x3d2aa9c1;
            auVar56._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar56._12_4_ = 0x3d2aa9c1;
            auVar56._16_4_ = 0x3d2aa9c1;
            auVar56._20_4_ = 0x3d2aa9c1;
            auVar56._24_4_ = 0x3d2aa9c1;
            auVar56._28_4_ = 0x3d2aa9c1;
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar35,auVar56);
            auVar57._8_4_ = 0x3e2aaaaa;
            auVar57._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar57._12_4_ = 0x3e2aaaaa;
            auVar57._16_4_ = 0x3e2aaaaa;
            auVar57._20_4_ = 0x3e2aaaaa;
            auVar57._24_4_ = 0x3e2aaaaa;
            auVar57._28_4_ = 0x3e2aaaaa;
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar35,auVar57);
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar35,auVar69);
            auVar4 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar7,auVar35);
            auVar46._0_4_ = (int)auVar1._0_4_;
            auVar46._4_4_ = (int)auVar1._4_4_;
            auVar46._8_4_ = (int)auVar1._8_4_;
            auVar46._12_4_ = (int)auVar1._12_4_;
            auVar40._16_4_ = (int)auVar1._16_4_;
            auVar40._0_16_ = auVar46;
            auVar40._20_4_ = (int)auVar1._20_4_;
            auVar40._24_4_ = (int)auVar1._24_4_;
            auVar40._28_4_ = (int)auVar1._28_4_;
            auVar61 = vpslld_avx(auVar46,0x17);
            auVar46 = vpslld_avx(auVar40._16_16_,0x17);
            auVar46 = vpaddd_avx(auVar67,auVar46);
            auVar61 = vpaddd_avx(auVar67,auVar61);
            auVar8._4_4_ = auVar61._4_4_ * *(float *)((long)*pauVar24 + 4);
            auVar8._0_4_ = auVar61._0_4_ * *(float *)*pauVar24;
            auVar8._8_4_ = auVar61._8_4_ * *(float *)((long)*pauVar24 + 8);
            auVar8._12_4_ = auVar61._12_4_ * *(float *)((long)*pauVar24 + 0xc);
            auVar8._16_4_ = auVar46._0_4_ * *(float *)((long)*pauVar24 + 0x10);
            auVar8._20_4_ = auVar46._4_4_ * *(float *)((long)*pauVar24 + 0x14);
            auVar8._24_4_ = auVar46._8_4_ * *(float *)((long)*pauVar24 + 0x18);
            auVar8._28_4_ = auVar46._12_4_;
            auVar46 = vfmadd213ps_fma(auVar8,ZEXT1632(auVar4),auVar8);
            *pauVar24 = ZEXT1632(auVar46);
            pauVar33 = pauVar33 + 1;
            pauVar24 = pauVar24 + 1;
            iVar17 = iVar17 + 8;
            uVar15 = uVar26;
            fStack_114 = local_118;
            fStack_110 = local_118;
            fStack_10c = local_118;
            fStack_108 = local_118;
            fStack_104 = local_118;
            fStack_100 = local_118;
            fStack_fc = local_118;
            local_98 = auVar36;
          } while (iVar17 < (int)uVar25);
        }
        if (uVar25 - uVar15 != 0 && (int)uVar15 <= (int)uVar25) {
          lVar30 = 0;
          do {
            auVar38 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar33 + lVar30 * 4)),auVar65._0_16_,
                                      ZEXT416((uint)(this->super_LRN).bias));
            fVar34 = powf(auVar38._0_4_,-(this->super_LRN).beta);
            auVar65 = ZEXT1664(local_f8);
            *(float *)((long)*pauVar24 + lVar30 * 4) =
                 fVar34 * *(float *)((long)*pauVar24 + lVar30 * 4);
            lVar30 = lVar30 + 1;
          } while (uVar25 - uVar15 != (int)lVar30);
        }
        uVar19 = uVar19 + 1;
        bottom_top_blob = local_188;
        uVar21 = local_180;
        uVar26 = (uint)local_190;
      } while (uVar19 != local_180);
    }
    piVar9 = (int *)CONCAT44(uStack_1cc,local_1d8._8_4_);
    iVar17 = -100;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_1b8 == (Allocator *)0x0) {
          if ((void *)local_1d8._0_8_ != (void *)0x0) {
            free((void *)local_1d8._0_8_);
          }
        }
        else {
          (*local_1b8->_vptr_Allocator[3])();
        }
      }
    }
    local_198 = 0;
    local_1d8._0_8_ = (void *)0x0;
    local_1d8._8_4_ = 0;
    uStack_1cc = 0.0;
    local_1c8 = 0;
    iStack_1c4 = 0;
    local_1c0 = 0;
    iStack_1b0 = 0;
    fStack_1ac = 0.0;
    iStack_1a8 = 0;
    iStack_1a4 = 0;
    iStack_1a0 = 0;
    if ((char)local_170 != '\0') goto LAB_0032fe0f;
  }
  else if (iVar28 == 1) {
    piVar9 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
    local_1d8._0_8_ = local_168._0_8_;
    local_1d8._8_4_ = local_168._8_4_;
    uStack_1cc = (float)local_168._12_4_;
    local_1c8 = local_158;
    iStack_1c4 = iStack_154;
    local_1c0 = local_150;
    local_1b8 = local_148;
    iStack_1b0 = iStack_140;
    fStack_1ac = fStack_13c;
    iStack_1a8 = (int)uStack_138;
    iStack_1a4 = SUB84(uStack_138,4);
    iStack_1a0 = local_130;
    local_198 = local_128;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    uVar26 = (this->super_LRN).local_size;
    fVar34 = local_118;
    if (1 < (int)uVar26) {
      uVar25 = uVar26 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border((Mat *)local_168,(Mat *)local_1d8,uVar25,~uVar25 + uVar26,uVar25,
                       ~uVar25 + uVar26,0,0.0,(Option *)&_space_ofs);
      fVar34 = fStack_1ac;
      if ((Allocator *)local_1d8._0_8_ == (Allocator *)0x0 || (long)iStack_1a0 * local_198 == 0) {
        piVar9 = (int *)CONCAT44(uStack_1cc,local_1d8._8_4_);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (local_1b8 == (Allocator *)0x0) {
              if ((Allocator *)local_1d8._0_8_ != (Allocator *)0x0) {
                free((void *)local_1d8._0_8_);
              }
            }
            else {
              (*local_1b8->_vptr_Allocator[3])();
            }
          }
        }
        local_198 = 0;
        local_1d8._0_8_ = (void *)0x0;
        local_1d8._8_4_ = 0;
        uStack_1cc = 0.0;
        local_1c8 = 0;
        iStack_1c4 = 0;
        local_1c0 = 0;
        iStack_1b0 = 0;
        fStack_1ac = 0.0;
        iStack_1a8 = 0;
        iStack_1a4 = 0;
        iStack_1a0 = 0;
        goto LAB_0032fe0f;
      }
    }
    iVar17 = (this->super_LRN).local_size;
    uVar26 = iVar17 * iVar17;
    local_98._0_4_ = (this->super_LRN).alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar26,&local_1d9);
    piVar13 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar28 = (this->super_LRN).local_size;
    if (0 < iVar28) {
      iVar16 = 0;
      iVar18 = 0;
      iVar22 = 0;
      do {
        if (0 < (this->super_LRN).local_size) {
          lVar30 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar22 + lVar30] = iVar18 + (int)lVar30;
            lVar30 = lVar30 + 1;
            iVar27 = (int)lVar30;
          } while (iVar27 < (this->super_LRN).local_size);
          iVar22 = iVar22 + iVar27;
          iVar18 = iVar18 + iVar27;
        }
        iVar18 = iVar18 + ((int)fVar34 - iVar28);
        iVar16 = iVar16 + 1;
      } while (iVar16 < (this->super_LRN).local_size);
    }
    if (0 < (int)local_180) {
      local_170 = (long)(int)local_118;
      local_c8 = local_188->data;
      local_d0 = local_188->cstep * local_188->elemsize;
      local_d8 = (Allocator *)local_1d8._0_8_;
      local_e0 = local_198 * CONCAT44(iStack_1c4,local_1c8);
      local_c0 = (long)(int)fStack_1ac * CONCAT44(iStack_1c4,local_1c8);
      local_f8._0_4_ = 1.0 / (float)(int)uVar26;
      local_178 = 0;
      do {
        if (0 < (int)(uint)local_190) {
          local_188 = (Mat *)((long)&local_d8->_vptr_Allocator + local_e0 * local_178);
          pvVar32 = (void *)(local_d0 * local_178 + (long)local_c8);
          auVar11._24_8_ = 0;
          auVar11._0_24_ = local_b8._8_24_;
          local_b8 = auVar11 << 0x40;
          do {
            pMVar12 = local_188;
            if (0 < (int)local_118) {
              lVar30 = local_c0 * local_b8._0_8_;
              lVar31 = 0;
              do {
                if (iVar17 == 0) {
                  fVar34 = 0.0;
                }
                else {
                  fVar34 = 0.0;
                  uVar21 = 0;
                  do {
                    fVar34 = fVar34 + *(float *)((long)&pMVar12->data +
                                                (long)piVar13[uVar21] * 4 + lVar31 * 4 + lVar30);
                    uVar21 = uVar21 + 1;
                  } while (uVar26 + (uVar26 == 0) != uVar21);
                }
                auVar38 = vfmadd213ss_fma(ZEXT416((uint)(fVar34 * (float)local_98._0_4_)),
                                          ZEXT416((uint)local_f8._0_4_),
                                          ZEXT416((uint)(this->super_LRN).bias));
                fVar34 = powf(auVar38._0_4_,-(this->super_LRN).beta);
                *(float *)((long)pvVar32 + lVar31 * 4) =
                     fVar34 * *(float *)((long)pvVar32 + lVar31 * 4);
                lVar31 = lVar31 + 1;
              } while (lVar31 != CONCAT44(fStack_114,local_118));
            }
            pvVar32 = (void *)((long)pvVar32 + local_170 * 4);
            uVar21 = local_b8._0_8_ + 1;
            local_b8._0_8_ = uVar21;
          } while (uVar21 != local_190);
        }
        local_178 = local_178 + 1;
      } while (local_178 != local_180);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar9 = (int *)CONCAT44(uStack_1cc,local_1d8._8_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_1b8 == (Allocator *)0x0) {
          if ((Allocator *)local_1d8._0_8_ != (Allocator *)0x0) {
            free((void *)local_1d8._0_8_);
          }
        }
        else {
          (*local_1b8->_vptr_Allocator[3])();
        }
      }
    }
    local_198 = 0;
    local_1d8._0_8_ = (void *)0x0;
    local_1d8._8_4_ = 0;
    uStack_1cc = 0.0;
    local_1c8 = 0;
    iStack_1c4 = 0;
    local_1c0 = 0;
    iStack_1b0 = 0;
    fStack_1ac = 0.0;
    iStack_1a8 = 0;
    iStack_1a4 = 0;
    iStack_1a0 = 0;
  }
  iVar17 = 0;
LAB_0032fe0f:
  piVar9 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_148 == (Allocator *)0x0) {
        if ((Allocator *)local_168._0_8_ != (Allocator *)0x0) {
          free((void *)local_168._0_8_);
        }
      }
      else {
        (*local_148->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int LRN_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}